

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

PyObject * pybind11_meta_call(PyObject *type,PyObject *args,PyObject *kwargs)

{
  void ***this;
  undefined8 uVar1;
  bool bVar2;
  undefined8 uVar3;
  PyTypeObject *type_00;
  string local_d8;
  value_and_holder *local_b8;
  value_and_holder *vh;
  iterator __end2;
  iterator __begin2;
  values_and_holders *__range2;
  instance *instance;
  PyObject *self;
  PyObject *kwargs_local;
  PyObject *args_local;
  PyObject *type_local;
  
  type_local = (PyObject *)(*_PyFloat_FromDouble)(type,args,kwargs);
  if ((instance *)type_local == (instance *)0x0) {
    type_local = (PyObject *)0x0;
  }
  else {
    pybind11::detail::values_and_holders::values_and_holders
              ((values_and_holders *)&__begin2.curr.vh,(instance *)type_local);
    this = &__begin2.curr.vh;
    pybind11::detail::values_and_holders::begin
              ((iterator *)&__end2.curr.vh,(values_and_holders *)this);
    pybind11::detail::values_and_holders::end((iterator *)&vh,(values_and_holders *)this);
    while (bVar2 = pybind11::detail::values_and_holders::iterator::operator!=
                             ((iterator *)&__end2.curr.vh,(iterator *)&vh), bVar2) {
      local_b8 = pybind11::detail::values_and_holders::iterator::operator*
                           ((iterator *)&__end2.curr.vh);
      bVar2 = pybind11::detail::value_and_holder::holder_constructed(local_b8);
      uVar1 = _PyExc_TypeError;
      if (!bVar2) {
        pybind11::detail::get_fully_qualified_tp_name_abi_cxx11_
                  (&local_d8,(detail *)local_b8->type->type,type_00);
        uVar3 = std::__cxx11::string::c_str();
        PyErr_Format(uVar1,"%.200s.__init__() must be called when overriding __init__",uVar3);
        std::__cxx11::string::~string((string *)&local_d8);
        _Py_DECREF(type_local);
        return (PyObject *)0x0;
      }
      pybind11::detail::values_and_holders::iterator::operator++((iterator *)&__end2.curr.vh);
    }
  }
  return type_local;
}

Assistant:

inline PyObject *pybind11_meta_call(PyObject *type, PyObject *args, PyObject *kwargs) {

    // use the default metaclass call to create/initialize the object
    PyObject *self = PyType_Type.tp_call(type, args, kwargs);
    if (self == nullptr) {
        return nullptr;
    }

    // This must be a pybind11 instance
    auto instance = reinterpret_cast<detail::instance *>(self);

    // Ensure that the base __init__ function(s) were called
    for (const auto &vh : values_and_holders(instance)) {
        if (!vh.holder_constructed()) {
            PyErr_Format(PyExc_TypeError, "%.200s.__init__() must be called when overriding __init__",
                         get_fully_qualified_tp_name(vh.type->type).c_str());
            Py_DECREF(self);
            return nullptr;
        }
    }

    return self;
}